

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.h
# Opt level: O0

uint value_barrier(uint a)

{
  uint r;
  uint a_local;
  
  return a;
}

Assistant:

static ossl_inline unsigned int value_barrier(unsigned int a)
{
#if !defined(OPENSSL_NO_ASM) && defined(__GNUC__)
    unsigned int r;
    __asm__("" : "=r"(r) : "0"(a));
#else
    volatile unsigned int r = a;
#endif
    return r;
}